

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiIO::AddInputCharacter(ImGuiIO *this,ImWchar c)

{
  int *piVar1;
  int iVar2;
  unsigned_short *puVar3;
  unsigned_short *__dest;
  int iVar4;
  int iVar5;
  
  iVar5 = (this->InputQueueCharacters).Size;
  iVar2 = (this->InputQueueCharacters).Capacity;
  if (iVar5 == iVar2) {
    iVar5 = iVar5 + 1;
    if (iVar2 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar2 / 2 + iVar2;
    }
    if (iVar5 < iVar4) {
      iVar5 = iVar4;
    }
    if (iVar2 < iVar5) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (unsigned_short *)(*GImAllocatorAllocFunc)((long)iVar5 * 2,GImAllocatorUserData);
      puVar3 = (this->InputQueueCharacters).Data;
      if (puVar3 != (unsigned_short *)0x0) {
        memcpy(__dest,puVar3,(long)(this->InputQueueCharacters).Size * 2);
        puVar3 = (this->InputQueueCharacters).Data;
        if ((puVar3 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar3,GImAllocatorUserData);
      }
      (this->InputQueueCharacters).Data = __dest;
      (this->InputQueueCharacters).Capacity = iVar5;
    }
  }
  (this->InputQueueCharacters).Data[(this->InputQueueCharacters).Size] = c;
  (this->InputQueueCharacters).Size = (this->InputQueueCharacters).Size + 1;
  return;
}

Assistant:

void ImGuiIO::AddInputCharacter(ImWchar c)
{
    InputQueueCharacters.push_back(c);
}